

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
CompileFeaturesNode::Evaluate
          (string *__return_storage_ptr__,CompileFeaturesNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  _Rb_tree_node_base *__k;
  cmMakefile *this_00;
  bool bVar1;
  string *targetName;
  mapped_type *pmVar2;
  iterator iVar3;
  cmValue cVar4;
  undefined7 extraout_var;
  long *plVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  cmValue cVar7;
  mapped_type *this_01;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  ulong *puVar10;
  _Base_ptr p_Var11;
  int iVar12;
  string error;
  string lang;
  cmGeneratorTarget *target;
  cmStandardLevelResolver standardResolver;
  LangMap testedFeatures;
  string local_108;
  cmGeneratorExpressionContext *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  GeneratorExpressionContent *local_d8;
  key_type local_d0;
  cmGeneratorExpressionDAGChecker *local_b0;
  _Base_ptr local_a8;
  cmGeneratorTarget *local_a0;
  string local_98;
  cmStandardLevelResolver local_78;
  undefined1 local_70 [32];
  _Rb_tree_node_base *local_50;
  size_t local_48;
  map<const_cmGeneratorTarget_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *local_40;
  _Rb_tree_node_base *local_38;
  
  local_a0 = context->HeadTarget;
  if (local_a0 == (cmGeneratorTarget *)0x0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_70,content);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,
               "$<COMPILE_FEATURE> may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target."
               ,"");
    reportError(context,(string *)local_70,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    context->HadHeadSensitiveCondition = true;
    local_d8 = content;
    local_b0 = dagChecker;
    if (Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
        ::availableFeatures_abi_cxx11_ == '\0') {
      Evaluate();
    }
    local_70._24_8_ = local_70 + 8;
    local_70._8_4_ = _S_red;
    local_70._16_8_ = (_Base_ptr)0x0;
    local_48 = 0;
    local_78.Makefile = context->LG->Makefile;
    p_Var11 = (_Base_ptr)
              (parameters->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_a8 = (_Base_ptr)
               (parameters->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    local_e8 = context;
    local_50 = (_Rb_tree_node_base *)local_70._24_8_;
    if (p_Var11 != local_a8) {
      local_e0 = &__return_storage_ptr__->field_2;
      do {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        local_108._M_string_length = 0;
        local_108.field_2._M_allocated_capacity =
             local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        targetName = cmTarget::GetName_abi_cxx11_(local_e8->HeadTarget->Target);
        bVar1 = cmStandardLevelResolver::CompileFeatureKnown
                          (&local_78,targetName,(string *)p_Var11,&local_d0,&local_108);
        if (!bVar1) {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,local_d8);
          reportError(local_e8,&local_98,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e0;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00570ffd:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          goto LAB_005712f3;
        }
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>_>_>
                               *)local_70,&local_d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pmVar2->Values,(value_type *)p_Var11);
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>_>_>
                ::find(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                        ::availableFeatures_abi_cxx11_._M_t,&local_d0);
        if ((_Rb_tree_header *)iVar3._M_node ==
            &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
             ::availableFeatures_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          cVar4 = cmStandardLevelResolver::CompileFeaturesAvailable(&local_78,&local_d0,&local_108);
          if (cVar4.Value == (string *)0x0) {
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,local_d8);
            reportError(local_e8,&local_98,&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e0;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          }
          else {
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>_>_>
                     ::operator[](&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::availableFeatures_abi_cxx11_,&local_d0);
            cmList::assign(pmVar2,cVar4,Yes,No);
          }
          if (cVar4.Value == (string *)0x0) goto LAB_00570ffd;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,
                          CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                   local_d0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        p_Var11 = p_Var11 + 1;
      } while (p_Var11 != local_a8);
    }
    if (local_b0 == (cmGeneratorExpressionDAGChecker *)0x0) {
      local_b0 = (cmGeneratorExpressionDAGChecker *)0x0;
    }
    else {
      bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (local_b0,(cmGeneratorTarget *)0x0,ANY);
      local_b0 = (cmGeneratorExpressionDAGChecker *)
                 CONCAT44(local_b0._4_4_,(int)CONCAT71(extraout_var,bVar1));
    }
    if ((_Rb_tree_node_base *)local_70._24_8_ != (_Rb_tree_node_base *)(local_70 + 8)) {
      local_d8 = (GeneratorExpressionContent *)&local_e8->Config;
      local_e0 = &__return_storage_ptr__->field_2;
      local_40 = &local_e8->MaxLanguageStandard;
      p_Var9 = (_Rb_tree_node_base *)local_70._24_8_;
      do {
        __k = p_Var9 + 1;
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>_>_>
                 ::operator[](&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                               ::availableFeatures_abi_cxx11_,(key_type *)__k);
        this_00 = local_e8->LG->Makefile;
        std::operator+(&local_d0,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
        puVar10 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_108.field_2._M_allocated_capacity = *puVar10;
          local_108.field_2._8_8_ = plVar5[3];
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        }
        else {
          local_108.field_2._M_allocated_capacity = *puVar10;
          local_108._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_108._M_string_length = plVar5[1];
        *plVar5 = (long)puVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        cVar4 = cmMakefile::GetDefinition(this_00,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,
                          CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                   local_d0.field_2._M_local_buf[0]) + 1);
        }
        p_Var11 = *(_Base_ptr *)(p_Var9 + 2);
        local_a8 = p_Var9[2]._M_parent;
        local_38 = p_Var9;
        if (p_Var11 != local_a8) {
          do {
            _Var6 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((pmVar2->Values).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (pmVar2->Values).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,p_Var11);
            if (_Var6._M_current ==
                (pmVar2->Values).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e0;
              iVar12 = 1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,"0","");
            }
            else if ((cVar4.Value == (string *)0x0) || ((cVar4.Value)->_M_string_length != 0)) {
              bVar1 = cmStandardLevelResolver::HaveStandardAvailable
                                (&local_78,local_a0,(string *)__k,(string *)local_d8,
                                 (string *)p_Var11);
              iVar12 = 0;
              if (!bVar1) {
                if ((char)local_b0 == '\0') {
                  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e0;
                  iVar12 = 1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,"0","");
                }
                else {
                  cVar7 = cmGeneratorTarget::GetLanguageStandard
                                    (local_a0,(string *)__k,(string *)local_d8);
                  if (cVar7.Value == (string *)0x0) {
                    cVar7 = cVar4;
                  }
                  if (cVar7.Value == (string *)0x0) {
                    __assert_fail("l",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                  ,0xcd8,
                                  "virtual std::string CompileFeaturesNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                                 );
                  }
                  this_01 = std::
                            map<const_cmGeneratorTarget_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                            ::operator[](local_40,&local_a0);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](this_01,(key_type *)__k);
                  std::__cxx11::string::_M_assign((string *)pmVar8);
                  iVar12 = 0;
                }
              }
            }
            else {
              iVar12 = 7;
            }
            if ((iVar12 != 7) && (iVar12 != 0)) goto LAB_005712a0;
            p_Var11 = p_Var11 + 1;
          } while (p_Var11 != local_a8);
        }
        iVar12 = 6;
LAB_005712a0:
        if ((iVar12 != 6) && (iVar12 != 0)) goto LAB_005712f3;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_38);
      } while (p_Var9 != (_Rb_tree_node_base *)(local_70 + 8));
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"1","");
LAB_005712f3:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmList>_>_>
                 *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    cmGeneratorTarget const* target = context->HeadTarget;
    if (!target) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<COMPILE_FEATURE> may only be used with binary targets.  It may "
        "not be used with add_custom_command or add_custom_target.");
      return std::string();
    }
    context->HadHeadSensitiveCondition = true;

    using LangMap = std::map<std::string, cmList>;
    static LangMap availableFeatures;

    LangMap testedFeatures;
    cmStandardLevelResolver standardResolver(context->LG->GetMakefile());
    for (std::string const& p : parameters) {
      std::string error;
      std::string lang;
      if (!standardResolver.CompileFeatureKnown(
            context->HeadTarget->Target->GetName(), p, lang, &error)) {
        reportError(context, content->GetOriginalExpression(), error);
        return std::string();
      }
      testedFeatures[lang].push_back(p);

      if (availableFeatures.find(lang) == availableFeatures.end()) {
        cmValue featuresKnown =
          standardResolver.CompileFeaturesAvailable(lang, &error);
        if (!featuresKnown) {
          reportError(context, content->GetOriginalExpression(), error);
          return std::string();
        }
        availableFeatures[lang].assign(featuresKnown);
      }
    }

    bool evalLL = dagChecker && dagChecker->EvaluatingLinkLibraries();

    for (auto const& lit : testedFeatures) {
      std::vector<std::string> const& langAvailable =
        availableFeatures[lit.first];
      cmValue standardDefault = context->LG->GetMakefile()->GetDefinition(
        "CMAKE_" + lit.first + "_STANDARD_DEFAULT");
      for (std::string const& it : lit.second) {
        if (!cm::contains(langAvailable, it)) {
          return "0";
        }
        if (standardDefault && standardDefault->empty()) {
          // This compiler has no notion of language standard levels.
          // All features known for the language are always available.
          continue;
        }
        if (!standardResolver.HaveStandardAvailable(target, lit.first,
                                                    context->Config, it)) {
          if (evalLL) {
            cmValue l =
              target->GetLanguageStandard(lit.first, context->Config);
            if (!l) {
              l = standardDefault;
            }
            assert(l);
            context->MaxLanguageStandard[target][lit.first] = *l;
          } else {
            return "0";
          }
        }
      }
    }
    return "1";
  }